

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O3

int __thiscall tetgenmesh::segfacetadjacent(tetgenmesh *this,face *subseg,face *subsh)

{
  uint *puVar1;
  byte *pbVar2;
  int iVar3;
  point pdVar4;
  point pdVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  iVar9 = *(int *)((long)subseg->sh + (long)this->shmarkindex * 4 + 8);
  pdVar4 = this->segmentendpointslist[(long)iVar9 * 2];
  pdVar5 = this->segmentendpointslist[iVar9 * 2 + 1];
  puVar1 = (uint *)((long)pdVar4 + (long)this->pointmarkindex * 4 + 4);
  *puVar1 = *puVar1 | 1;
  puVar1 = (uint *)((long)pdVar5 + (long)this->pointmarkindex * 4 + 4);
  *puVar1 = *puVar1 | 1;
  lVar8 = (long)*(int *)((long)subsh->sh + (long)this->shmarkindex * 4 + 8);
  iVar9 = this->idx2facetlist[lVar8];
  lVar7 = (long)iVar9;
  iVar3 = this->idx2facetlist[lVar8 + 1];
  if (iVar9 < iVar3) {
    iVar9 = 0;
    do {
      iVar9 = iVar9 + (*(uint *)((long)this->facetverticeslist[lVar7] +
                                (long)this->pointmarkindex * 4 + 4) & 1);
      lVar7 = lVar7 + 1;
    } while (iVar3 != lVar7);
    uVar6 = (uint)(iVar9 == 1);
  }
  else {
    uVar6 = 0;
  }
  pbVar2 = (byte *)((long)pdVar4 + (long)this->pointmarkindex * 4 + 4);
  *pbVar2 = *pbVar2 & 0xfe;
  puVar1 = (uint *)((long)pdVar5 + (long)this->pointmarkindex * 4 + 4);
  *puVar1 = *puVar1 & 0xfffffffe;
  return uVar6;
}

Assistant:

inline int tetgenmesh::getfacetindex(face& s)
{
  return ((int *) (s.sh))[shmarkindex + 2];
}